

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::STEP::EXPRESS::DataType> __thiscall
Assimp::STEP::EXPRESS::DataType::Parse
          (DataType *this,char **inout,uint64_t line,ConversionSchema *schema)

{
  _Rb_tree_header *p_Var1;
  Assimp AVar2;
  char cVar3;
  Assimp *pAVar4;
  Assimp *pAVar5;
  const_iterator cVar6;
  Logger *this_00;
  _func_int *p_Var7;
  char *pcVar8;
  SyntaxError *pSVar9;
  bool bVar10;
  bool bVar11;
  _func_int **pp_Var12;
  long lVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  ulong uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  undefined **ppuVar15;
  char cVar16;
  _func_int *p_Var17;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sVar18;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> sVar19;
  string s;
  undefined1 local_71;
  Assimp *local_70;
  key_type local_68;
  DataType local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  ConversionSchema *local_38;
  
  for (local_70 = (Assimp *)*inout; (*local_70 == (Assimp)0x20 || (*local_70 == (Assimp)0x9));
      local_70 = local_70 + 1) {
  }
  if (((ulong)(byte)*local_70 < 0x2d) &&
     ((0x100100003601U >> ((ulong)(byte)*local_70 & 0x3f) & 1) != 0)) {
    pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"unexpected token, expected parameter","");
    SyntaxError::SyntaxError(pSVar9,&local_68,line);
    __cxa_throw(pSVar9,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (schema != (ConversionSchema *)0x0) {
    bVar11 = false;
    pAVar4 = local_70;
    do {
      AVar2 = *pAVar4;
      if ((byte)AVar2 < 0x29) {
        if (AVar2 == (Assimp)0x0) break;
        if (AVar2 == (Assimp)0x28) goto LAB_0069bfa6;
      }
      else if ((AVar2 == (Assimp)0x29) || (AVar2 == (Assimp)0x2c)) break;
      bVar10 = true;
      if (AVar2 == (Assimp)0x9) {
        bVar10 = bVar11;
      }
      if (AVar2 == (Assimp)0x20) {
        bVar10 = bVar11;
      }
      bVar11 = bVar10;
      pAVar4 = pAVar4 + 1;
    } while( true );
  }
LAB_0069c093:
  pAVar4 = local_70;
  switch(*local_70) {
  case (Assimp)0x22:
    pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"binary data not supported yet","");
    SyntaxError::SyntaxError(pSVar9,&local_68,line);
    __cxa_throw(pSVar9,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  case (Assimp)0x23:
    local_70 = local_70 + 1;
    local_48._vptr_DataType =
         (_func_int **)
         strtoul10_64(local_70,(char *)inout,(char **)0x0,&switchD_0069c0b1::switchdataD_0071c0c0);
    local_68._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::STEP::EXPRESS::ENTITY,std::allocator<Assimp::STEP::EXPRESS::ENTITY>,unsigned_long>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length,
               (ENTITY **)&local_68,(allocator<Assimp::STEP::EXPRESS::ENTITY> *)&local_71,
               (unsigned_long *)&local_48);
    this->_vptr_DataType = (_func_int **)local_68._M_dataplus._M_p;
    this[1]._vptr_DataType = (_func_int **)0x0;
    ppuVar15 = (undefined **)extraout_RDX_01;
    goto LAB_0069c3bc;
  case (Assimp)0x24:
    *inout = (char *)(local_70 + 1);
    local_68._M_string_length = (size_type)operator_new(0x18);
    *(_func_int **)(local_68._M_string_length + 8) = (_func_int *)0x100000001;
    *(undefined ***)local_68._M_string_length = &PTR___Sp_counted_ptr_inplace_008ff528;
    ppuVar15 = &PTR__DataType_008ff578;
    break;
  default:
    pAVar5 = local_70;
    do {
      do {
        local_70 = pAVar5;
        uVar14 = (ulong)(byte)*local_70;
        pAVar5 = local_70 + 1;
      } while (0x2e < uVar14);
      if ((0x120100000201U >> (uVar14 & 0x3f) & 1) != 0) {
        AVar2 = *pAVar4;
        bVar11 = AVar2 == (Assimp)0x2b || AVar2 == (Assimp)0x2d;
        p_Var7 = (_func_int *)
                 strtoul10_64(pAVar4 + bVar11,(char *)inout,(char **)0x0,
                              (uint *)CONCAT71(0x1201000002,bVar11));
        p_Var17 = (_func_int *)-(long)p_Var7;
        if (AVar2 != (Assimp)0x2d) {
          p_Var17 = p_Var7;
        }
        local_68._M_string_length = (size_type)operator_new(0x20);
        *(_func_int **)(local_68._M_string_length + 8) = (_func_int *)0x100000001;
        *(undefined ***)local_68._M_string_length = &PTR___Sp_counted_ptr_inplace_008ff738;
        pp_Var12 = (_func_int **)(local_68._M_string_length + 0x10);
        ppuVar15 = &PTR__DataType_008ff788;
        *(undefined ***)(local_68._M_string_length + 0x10) = &PTR__DataType_008ff788;
        *(_func_int **)(local_68._M_string_length + 0x18) = p_Var17;
        goto LAB_0069c3b9;
      }
    } while (uVar14 != 0x2e);
    pcVar8 = fast_atoreal_move<double>(pAVar4,(char *)&local_68,(double *)0x1,true);
    *inout = pcVar8;
    local_68._M_string_length = (size_type)operator_new(0x20);
    *(_func_int **)(local_68._M_string_length + 8) = (_func_int *)0x100000001;
    *(undefined ***)local_68._M_string_length = &PTR___Sp_counted_ptr_inplace_008ff6c8;
    pp_Var12 = (_func_int **)(local_68._M_string_length + 0x10);
    ppuVar15 = &PTR__DataType_008ff718;
    *(undefined ***)(local_68._M_string_length + 0x10) = &PTR__DataType_008ff718;
    *(pointer *)(local_68._M_string_length + 0x18) = local_68._M_dataplus._M_p;
    goto LAB_0069c3b9;
  case (Assimp)0x27:
    while( true ) {
      local_70 = pAVar4 + 1;
      if (*local_70 == (Assimp)0x27) break;
      pAVar4 = local_70;
      if (*local_70 == (Assimp)0x0) {
        pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"string literal not closed","");
        SyntaxError::SyntaxError(pSVar9,&local_68,line);
        __cxa_throw(pSVar9,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    AVar2 = pAVar4[2];
    while (AVar2 == (Assimp)0x27) {
      for (local_70 = local_70 + 2; *local_70 != (Assimp)0x27; local_70 = local_70 + 1) {
        if (*local_70 == (Assimp)0x0) {
          pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"string literal not closed","");
          SyntaxError::SyntaxError(pSVar9,&local_68,line);
          __cxa_throw(pSVar9,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      AVar2 = local_70[1];
    }
    *inout = (char *)(local_70 + 1);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68);
    bVar11 = StringToUTF8(&local_68);
    if (!bVar11) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"an error occurred reading escape sequences in ASCII text");
    }
    local_48._vptr_DataType = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>,std::allocator<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>>,std::__cxx11::string&>
              (&local_40,
               (PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **)&local_48,
               (allocator<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_71,&local_68);
    this->_vptr_DataType = (_func_int **)local_48;
    this[1]._vptr_DataType = (_func_int **)0x0;
    this[1]._vptr_DataType = (_func_int **)local_40._M_pi;
    ppuVar15 = (undefined **)extraout_RDX_02;
    goto LAB_0069c33a;
  case (Assimp)0x28:
    *inout = (char *)local_70;
    sVar19 = LIST::Parse((char **)&local_68,(uint64_t)inout,(ConversionSchema *)line);
    ppuVar15 = (undefined **)
               sVar19.
               super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    this->_vptr_DataType = (_func_int **)local_68._M_dataplus._M_p;
    this[1]._vptr_DataType = (_func_int **)0x0;
    this[1]._vptr_DataType = (_func_int **)local_68._M_string_length;
    goto LAB_0069c3c0;
  case (Assimp)0x2a:
    *inout = (char *)(local_70 + 1);
    local_68._M_string_length = (size_type)operator_new(0x18);
    *(_func_int **)(local_68._M_string_length + 8) = (_func_int *)0x100000001;
    *(undefined ***)local_68._M_string_length = &PTR___Sp_counted_ptr_inplace_008ff4b8;
    ppuVar15 = &PTR__DataType_008ff508;
    break;
  case (Assimp)0x2e:
    while( true ) {
      local_70 = pAVar4 + 1;
      if (*local_70 == (Assimp)0x2e) break;
      pAVar4 = local_70;
      if (*local_70 == (Assimp)0x0) {
        pSVar9 = (SyntaxError *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"enum not closed","");
        SyntaxError::SyntaxError(pSVar9,&local_68,line);
        __cxa_throw(pSVar9,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    *inout = (char *)(pAVar4 + 2);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68);
    local_48._vptr_DataType = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::STEP::EXPRESS::ENUMERATION,std::allocator<Assimp::STEP::EXPRESS::ENUMERATION>,std::__cxx11::string>
              (&local_40,(ENUMERATION **)&local_48,
               (allocator<Assimp::STEP::EXPRESS::ENUMERATION> *)&local_71,&local_68);
    this->_vptr_DataType = (_func_int **)local_48;
    this[1]._vptr_DataType = (_func_int **)0x0;
    this[1]._vptr_DataType = (_func_int **)local_40._M_pi;
    local_48._vptr_DataType = (_func_int **)0x0;
    ppuVar15 = (undefined **)extraout_RDX_03;
LAB_0069c33a:
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      ppuVar15 = (undefined **)extraout_RDX_04;
    }
    goto LAB_0069c3c0;
  }
  pp_Var12 = (_func_int **)(local_68._M_string_length + 0x10);
  *(undefined ***)(local_68._M_string_length + 0x10) = ppuVar15;
LAB_0069c3b9:
  this->_vptr_DataType = pp_Var12;
LAB_0069c3bc:
  this[1]._vptr_DataType = (_func_int **)local_68._M_string_length;
LAB_0069c3c0:
  sVar18.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar15;
  sVar18.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<const_Assimp::STEP::EXPRESS::DataType>)
         sVar18.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>;
LAB_0069bfa6:
  if (bVar11) {
    do {
      do {
        pAVar5 = pAVar4;
        pAVar4 = pAVar5 + -1;
      } while (pAVar5[-1] == (Assimp)0x9);
    } while (pAVar5[-1] == (Assimp)0x20);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_38 = (ConversionSchema *)line;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_70,pAVar5);
    if ((_func_int **)local_68._M_string_length != (_func_int **)0x0) {
      lVar13 = 0;
      do {
        cVar3 = local_68._M_dataplus._M_p[lVar13];
        cVar16 = cVar3 + ' ';
        if (0x19 < (byte)(cVar3 + 0xbfU)) {
          cVar16 = cVar3;
        }
        local_68._M_dataplus._M_p[lVar13] = cVar16;
        lVar13 = lVar13 + 1;
      } while (local_68._M_string_length != lVar13);
    }
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
                    *)schema,&local_68);
    p_Var1 = &(schema->converters)._M_t._M_impl.super__Rb_tree_header;
    ppuVar15 = (undefined **)extraout_RDX;
    if ((_Rb_tree_header *)cVar6._M_node != p_Var1) {
      do {
        local_70 = pAVar5 + 1;
        AVar2 = *pAVar5;
        pAVar5 = local_70;
      } while (AVar2 != (Assimp)0x28);
      sVar18 = Parse(this,(char **)&local_70,0xffffffffffffffff,(ConversionSchema *)0x0);
      ppuVar15 = (undefined **)
                 sVar18.
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      *inout = (char *)(local_70 + (*local_70 != (Assimp)0x0));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      ppuVar15 = (undefined **)extraout_RDX_00;
    }
    line = (uint64_t)local_38;
    if ((_Rb_tree_header *)cVar6._M_node != p_Var1) goto LAB_0069c3c0;
  }
  goto LAB_0069c093;
}

Assistant:

std::shared_ptr<const EXPRESS::DataType> EXPRESS::DataType::Parse(const char*& inout,uint64_t line, const EXPRESS::ConversionSchema* schema /*= NULL*/)
{
    const char* cur = inout;
    SkipSpaces(&cur);
    if (*cur == ',' || IsSpaceOrNewLine(*cur)) {
        throw STEP::SyntaxError("unexpected token, expected parameter",line);
    }

    // just skip over constructions such as IFCPLANEANGLEMEASURE(0.01) and read only the value
    if (schema) {
        bool ok = false;
        for(const char* t = cur; *t && *t != ')' && *t != ','; ++t) {
            if (*t=='(') {
                if (!ok) {
                    break;
                }
                for(--t;IsSpace(*t);--t);
                std::string s(cur,static_cast<size_t>(t-cur+1));
                std::transform(s.begin(),s.end(),s.begin(),&ToLower<char> );
                if (schema->IsKnownToken(s)) {
                    for(cur = t+1;*cur++ != '(';);
                    const std::shared_ptr<const EXPRESS::DataType> dt = Parse(cur);
                    inout = *cur ? cur+1 : cur;
                    return dt;
                }
                break;
            }
            else if (!IsSpace(*t)) {
                ok = true;
            }
        }
    }

    if (*cur == '*' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::ISDERIVED>();
    }
    else if (*cur == '$' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::UNSET>();
    }
    else if (*cur == '(' ) {
        // start of an aggregate, further parsing is done by the LIST factory constructor
        inout = cur;
        return EXPRESS::LIST::Parse(inout,line,schema);
    }
    else if (*cur == '.' ) {
        // enum (includes boolean)
        const char* start = ++cur;
        for(;*cur != '.';++cur) {
            if (*cur == '\0') {
                throw STEP::SyntaxError("enum not closed",line);
            }
        }
        inout = cur+1;
        return std::make_shared<EXPRESS::ENUMERATION>(std::string(start, static_cast<size_t>(cur-start) ));
    }
    else if (*cur == '#' ) {
        // object reference
        return std::make_shared<EXPRESS::ENTITY>(strtoul10_64(++cur,&inout));
    }
    else if (*cur == '\'' ) {
        // string literal
        const char* start = ++cur;

        for(;*cur != '\'';++cur)    {
            if (*cur == '\0')   {
                throw STEP::SyntaxError("string literal not closed",line);
            }
        }

        if (cur[1] == '\'') {
            // Vesanen: more than 2 escaped ' in one literal!
            do  {
                for(cur += 2;*cur != '\'';++cur)    {
                    if (*cur == '\0')   {
                        throw STEP::SyntaxError("string literal not closed",line);
                    }
                }
            }
            while(cur[1] == '\'');
        }

        inout = cur + 1;

        // assimp is supposed to output UTF8 strings, so we have to deal
        // with foreign encodings.
        std::string stemp = std::string(start, static_cast<size_t>(cur - start));
        if(!StringToUTF8(stemp)) {
            // TODO: route this to a correct logger with line numbers etc., better error messages
            ASSIMP_LOG_ERROR("an error occurred reading escape sequences in ASCII text");
        }

        return std::make_shared<EXPRESS::STRING>(stemp);
    }
    else if (*cur == '\"' ) {
        throw STEP::SyntaxError("binary data not supported yet",line);
    }

    // else -- must be a number. if there is a decimal dot in it,
    // parse it as real value, otherwise as integer.
    const char* start = cur;
    for(;*cur  && *cur != ',' && *cur != ')' && !IsSpace(*cur);++cur) {
        if (*cur == '.') {
            double f;
            inout = fast_atoreal_move<double>(start,f);
            return std::make_shared<EXPRESS::REAL>(f);
        }
    }

    bool neg = false;
    if (*start == '-') {
        neg = true;
        ++start;
    }
    else if (*start == '+') {
        ++start;
    }
    int64_t num = static_cast<int64_t>( strtoul10_64(start,&inout) );
    return std::make_shared<EXPRESS::INTEGER>(neg?-num:num);
}